

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O0

int gauden_normalize(float64 ***out,gauden_t *g)

{
  uint local_34;
  int ret;
  uint32 k;
  uint32 j;
  uint32 i;
  float64 sum;
  gauden_t *g_local;
  float64 ***out_local;
  
  k = 0;
  do {
    if (g->n_mgau <= k) {
      return 0;
    }
    for (ret = 0; (uint)ret < g->n_feat; ret = ret + 1) {
      _j = 0.0;
      for (local_34 = 0; local_34 < g->n_top; local_34 = local_34 + 1) {
        _j = (double)out[k][(uint)ret][local_34] + _j;
      }
      if ((_j == 0.0) && (!NAN(_j))) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                ,0x5af,"densities for feature %u sum to zero\n",(ulong)(uint)ret);
        return -1;
      }
      for (local_34 = 0; local_34 < g->n_top; local_34 = local_34 + 1) {
        out[k][(uint)ret][local_34] = (float64)((double)out[k][(uint)ret][local_34] / _j);
      }
    }
    k = k + 1;
  } while( true );
}

Assistant:

int
gauden_normalize(float64 ***out,
		 gauden_t *g)
{
    float64 sum;
    uint32 i, j, k;
    int ret = S3_SUCCESS;

    for (i = 0; i < g->n_mgau; i++) {
	for (j = 0; j < g->n_feat; j++) {

	    sum = 0;

	    for (k = 0; k < g->n_top; k++) {
		sum += out[i][j][k];
	    }

	    if (sum != 0) {
		for (k = 0; k < g->n_top; k++) {
		    out[i][j][k] /= sum;
		}
	    }
	    else {
		E_ERROR("densities for feature %u sum to zero\n", j);

		return S3_ERROR;
	    }
	}
    }

    return ret;
}